

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

int Curl_pgrsUpdate(Curl_easy *data)

{
  int *piVar1;
  uint uVar2;
  FILE *whereto;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  curl_off_t seconds;
  ulong uVar8;
  int iVar9;
  curltime now;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  now = Curl_now();
  _Var3 = progress_calc(data,now);
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).dl.total_size,
                         (double)(data->progress).dl.cur_size,(double)(data->progress).ul.total_size
                         ,(double)(data->progress).ul.cur_size);
      goto LAB_0014fd3e;
    }
    if (!_Var3) {
      return 0;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar4 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).dl.total_size,
                       (data->progress).dl.cur_size,(data->progress).ul.total_size,
                       (data->progress).ul.cur_size);
LAB_0014fd3e:
    Curl_set_in_callback(data,false);
    if ((iVar4 != 0) && (iVar4 != 0x10000001)) {
      Curl_failf(data,"Callback aborted");
    }
    iVar9 = 0;
    if (iVar4 != 0x10000001) {
      iVar9 = iVar4;
    }
    if (iVar4 != 0x10000001 || !_Var3) {
      return iVar9;
    }
  }
  lVar7 = (data->progress).timespent;
  if (((data->progress).flags & 0x80) == 0) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    piVar1 = &(data->progress).flags;
    *(byte *)piVar1 = (byte)*piVar1 | 0x80;
  }
  lVar7 = lVar7 / 1000000;
  uVar2 = (data->progress).flags;
  if (((uVar2 & 0x20) == 0) || (lVar5 = (data->progress).ul.speed, lVar5 < 1)) {
    lVar5 = 0;
LAB_0014fe46:
    local_a0 = 0;
  }
  else {
    uVar8 = (data->progress).ul.total_size;
    local_a0 = (data->progress).ul.cur_size;
    lVar5 = (long)uVar8 / lVar5;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) goto LAB_0014fe46;
      local_a0 = local_a0 * 100;
    }
    else {
      uVar8 = uVar8 / 100;
    }
    local_a0 = local_a0 / (long)uVar8;
  }
  if (((uVar2 & 0x40) == 0) || (lVar6 = (data->progress).dl.speed, lVar6 < 1)) {
    lVar6 = 0;
LAB_0014fecc:
    local_a8 = 0;
  }
  else {
    uVar8 = (data->progress).dl.total_size;
    local_a8 = (data->progress).dl.cur_size;
    lVar6 = (long)uVar8 / lVar6;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) goto LAB_0014fecc;
      local_a8 = local_a8 * 100;
    }
    else {
      uVar8 = uVar8 / 100;
    }
    local_a8 = local_a8 / (long)uVar8;
  }
  if (lVar6 < lVar5) {
    lVar6 = lVar5;
  }
  seconds = 0;
  if (0 < lVar6) {
    seconds = lVar6 - lVar7;
  }
  time2str(time_left,seconds);
  time2str(time_total,lVar6);
  time2str(local_96,lVar7);
  uVar2 = (data->progress).flags;
  lVar7 = (&(data->progress).ul.total_size)[(uVar2 & 0x20) == 0];
  lVar5 = (&(data->progress).dl.total_size)[(uVar2 & 0x40) == 0];
  uVar8 = lVar7 + lVar5;
  if (0x7fffffffffffffff - lVar7 < lVar5) {
    uVar8 = 0x7fffffffffffffff;
  }
  lVar7 = (data->progress).ul.cur_size + (data->progress).dl.cur_size;
  if ((long)uVar8 < 0x2711) {
    if ((long)uVar8 < 1) {
      lVar7 = 0;
    }
    else {
      lVar7 = (lVar7 * 100) / (long)uVar8;
    }
  }
  else {
    lVar7 = lVar7 / (long)(uVar8 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar8,max5[2]);
  max5data((data->progress).dl.cur_size,max5[0]);
  max5data((data->progress).ul.cur_size,max5[1]);
  max5data((data->progress).dl.speed,max5[3]);
  max5data((data->progress).ul.speed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar7,max5 + 2,local_a8,
                max5,local_a0,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  return pgrsupdate(data, showprogress);
}